

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags_unittest_main.cc
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  char **argv_local;
  int argc_local;
  
  iVar1 = gflags::main(argc,argv);
  return iVar1;
}

Assistant:

int main(int argc, char** argv) {
  return GFLAGS_NAMESPACE::main(argc, argv);
}